

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duel.h
# Opt level: O2

void __thiscall
duel::playCard(duel *this,hand *hand__,hand *enemyHand,field *field__,field *enemyField,
              uint position)

{
  pointer pcVar1;
  bool bVar2;
  uint uVar3;
  reference pvVar4;
  ostream *poVar5;
  duel *pdVar6;
  undefined1 local_80 [32];
  card temp;
  
  pvVar4 = std::vector<card,_std::allocator<card>_>::at(&hand__->hand_,(ulong)position);
  card::card(&temp,pvVar4);
  if (temp.value < 3) {
    std::__cxx11::string::string((string *)local_80,(string *)&temp.name);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_80,"1");
    uVar3 = temp.cardType;
    if ((bVar2) &&
       ((field__->field_).super__Vector_base<card,_std::allocator<card>_>._M_impl.
        super__Vector_impl_data._M_finish[-1].bolted != true)) {
      std::__cxx11::string::~string((string *)local_80);
      goto LAB_0010378e;
    }
    pdVar6 = (duel *)local_80;
    std::__cxx11::string::~string((string *)pdVar6);
    if (uVar3 == 4) goto LAB_0010378e;
  }
  else {
LAB_0010378e:
    pdVar6 = (duel *)&field__->field_;
    std::vector<card,std::allocator<card>>::emplace_back<card&>
              ((vector<card,std::allocator<card>> *)pdVar6,&temp);
  }
  switch(temp.cardType) {
  case 1:
    pcVar1 = (enemyField->field_).super__Vector_base<card,_std::allocator<card>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pcVar1[-1].bolted = true;
    if (pcVar1[-1].cardType == 4) {
      uVar3 = enemyField->pile >> 1;
    }
    else {
      uVar3 = enemyField->pile - pcVar1[-1].value;
    }
    enemyField->pile = uVar3;
    break;
  case 2:
    pdVar6 = (duel *)field__;
    std::swap<field>(field__,enemyField);
    break;
  case 3:
    pdVar6 = (duel *)enemyHand;
    hand::shuffleHand(enemyHand);
    uVar3 = pickCard(pdVar6,enemyHand,true);
    poVar5 = std::operator<<((ostream *)&std::cout,"Card discarded was ");
    pvVar4 = std::vector<card,_std::allocator<card>_>::at(&enemyHand->hand_,(ulong)uVar3);
    std::__cxx11::string::string((string *)local_80,(string *)&pvVar4->name);
    poVar5 = std::operator<<(poVar5,(string *)local_80);
    poVar5 = std::operator<<(poVar5,".");
    std::endl<char,std::char_traits<char>>(poVar5);
    pdVar6 = (duel *)local_80;
    std::__cxx11::string::~string((string *)pdVar6);
    discardCard(pdVar6,uVar3,enemyHand);
    pdVar6 = (duel *)enemyHand;
    hand::sortHand(enemyHand);
    break;
  case 4:
    field__->pile = field__->pile << 1;
    goto LAB_0010394c;
  default:
    std::__cxx11::string::string((string *)local_80,(string *)&temp.name);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_80,"1");
    if (bVar2) {
      bVar2 = (field__->field_).super__Vector_base<card,_std::allocator<card>_>._M_impl.
              super__Vector_impl_data._M_finish[-1].bolted;
      pdVar6 = (duel *)local_80;
      std::__cxx11::string::~string((string *)pdVar6);
      if (bVar2 == true) {
        pcVar1 = (field__->field_).super__Vector_base<card,_std::allocator<card>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        pcVar1[-1].bolted = false;
        uVar3 = field__->pile;
        if (pcVar1[-1].cardType != 4) {
          uVar3 = pcVar1[-1].value;
        }
        field__->pile = uVar3 + field__->pile;
        break;
      }
    }
    else {
      pdVar6 = (duel *)local_80;
      std::__cxx11::string::~string((string *)pdVar6);
    }
    field__->pile = field__->pile + temp.value;
  }
  if (temp.cardType == 3) {
    discardCard(pdVar6,position,hand__);
    poVar5 = std::operator<<((ostream *)&std::cout,"Now play another card.");
    std::endl<char,std::char_traits<char>>(poVar5);
    pdVar6 = this;
    printField(this);
    uVar3 = pickCard(pdVar6,hand__,false);
    playCard(this,hand__,enemyHand,field__,enemyField,uVar3);
  }
  else {
LAB_0010394c:
    discardCard(pdVar6,position,hand__);
  }
  std::__cxx11::string::~string((string *)&temp.name);
  return;
}

Assistant:

void duel::playCard(hand &hand__, hand &enemyHand, field &field__, field &enemyField, unsigned int position) {
    // create pointer to card that is played
    /*unique_ptr<card> temp(&hand__.hand_.at(position));*/
	card temp = hand__.hand_.at(position);
    // put the card on the field if it has a value > 2 or if it is a '1' card and pile isn't bolted is or if it is force
    if( (temp.getValue() > 2 || (temp.getName()=="1" && !isBolted(field__)))
    || (isForce(temp))) field__.field_.emplace_back(temp);
    switch (temp.getCardType()) {
        // bolt, nullify a cards value/effect
        case 1:
            enemyField.field_.back().setBolted(true);
            // if enemy used force, revert it; else subtract the enemy's top card value
            if (isForce(enemyField.field_.back())) enemyField.setPile(enemyField.getPile() / 2);
            else enemyField.setPile(enemyField.getPile() - enemyField.field_.back().getValue());
            break;
        //mirror, swaps the fields
        case 2:
            swap(field__, enemyField);
            break;
        // blast, shuffles enemy hand and lets you choose which card from that hand to discard
        case 3:
            unsigned int enemyPosition;
            enemyHand.shuffleHand();
            // discard a card from the enemy's Hand
            enemyPosition = pickCard(enemyHand,true);
            cout << "Card discarded was " << enemyHand.hand_.at(enemyPosition).getName() << "." << endl;
            discardCard(enemyPosition, enemyHand);
            // sort it back
            enemyHand.sortHand();
            break;
        // force, doubles pile
        case 4:
            field__.setPile(field__.getPile() * 2);
            break;
        // regular card
        default:
            // if card played is '1' and top card on field is bolted, unbolt it
            if(temp.getName()=="1" && isBolted(field__)) {
                field__.field_.back().setBolted(false);
                // if bolted card was force, double pile; else add the bolted card's value back to pile
                if(isForce(field__.field_.back())) field__.setPile(field__.getPile() * 2);
                else field__.setPile(field__.getPile() + field__.field_.back().getValue());
            }
            // add value to pile when above condition is false
            else field__.setPile(field__.getPile() + temp.getValue());
            break;
    }
    // if blast was played, discard blast and play another card
    if(temp.getCardType() == 3) {
        discardCard(position,hand__);
        cout << "Now play another card." << endl;
        printField();
        playCard(hand__,enemyHand,field__,enemyField,pickCard(hand__,false));
    }
    // else discard card used from hand
    else discardCard(position,hand__);
}